

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPNBase::DataLoad(OPNBase *this,OPNBaseData *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  Timer::DataLoad(&this->super_Timer,&data->timer);
  uVar1 = data->clock;
  uVar2 = data->rate;
  uVar3 = data->psgrate;
  this->fmvolume = data->fmvolume;
  this->clock = uVar1;
  this->rate = uVar2;
  this->psgrate = uVar3;
  this->status = data->status;
  this->prescale = data->prescale;
  Chip::DataLoad(&this->chip,&data->chip);
  PSG::DataLoad(&this->psg,&data->psg);
  return;
}

Assistant:

void OPNBase::DataLoad(struct OPNBaseData* data) {
	Timer::DataLoad(&data->timer);
	fmvolume = data->fmvolume;
	clock = data->clock;
	rate = data->rate;
	psgrate = data->psgrate;
	status = data->status;
	prescale = data->prescale;
	chip.DataLoad(&data->chip);
	psg.DataLoad(&data->psg);
}